

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

pair<unsigned_char,_unsigned_int> * createHuffCode(uchar *a,uint number)

{
  byte bVar1;
  pair<unsigned_char,_unsigned_int> *ppVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  ppVar2 = (pair<unsigned_char,_unsigned_int> *)malloc((ulong)(number * 8));
  lVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  do {
    bVar1 = a[lVar3];
    if (bVar1 != 0) {
      lVar6 = 0;
      do {
        ppVar2[iVar4 + lVar6].first = (char)lVar3 + '\x01';
        ppVar2[iVar4 + lVar6].second = iVar5 + (int)lVar6;
        lVar6 = lVar6 + 1;
      } while ((uint)bVar1 != (uint)lVar6);
      iVar4 = iVar4 + (uint)lVar6;
      iVar5 = iVar5 + (uint)bVar1;
    }
    iVar5 = iVar5 * 2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return ppVar2;
}

Assistant:

std::pair<unsigned char, unsigned int>* createHuffCode(unsigned char *a, unsigned int number) {
    int si = sizeof(std::pair<unsigned char, unsigned int>);
    auto ret = (std::pair<unsigned char, unsigned int>*)malloc(si * number);
    int code = 0;
    int count = 0;
    for (int i = 0; i < 16; i++) {
        for (int j = 0; j < a[i]; j++) {
            ret[count++] = std::make_pair(i + 1, code);
            code += 1;
        }
        code = code << 1;
    }
    return ret;
}